

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

void Fxu_UpdateDouble(Fxu_Matrix *p)

{
  Fxu_Var *local_40;
  Fxu_Var *pVarD;
  Fxu_Var *pVarC;
  Fxu_Cube *pCubeNew2;
  Fxu_Cube *pCubeNew1;
  Fxu_Cube *pCube;
  Fxu_Double *pDiv;
  Fxu_Matrix *p_local;
  
  pDiv = (Fxu_Double *)p;
  pCube = (Fxu_Cube *)Fxu_HeapDoubleGetMax(p->pHeapDouble);
  Fxu_ListTableDelDivisor((Fxu_Matrix *)pDiv,(Fxu_Double *)pCube);
  Fxu_UpdateCreateNewVars((Fxu_Matrix *)pDiv,&pVarD,&local_40,2);
  pCubeNew2 = Fxu_MatrixAddCube((Fxu_Matrix *)pDiv,local_40,0);
  pCubeNew2->pFirst = pCubeNew2;
  pVarC = (Fxu_Var *)Fxu_MatrixAddCube((Fxu_Matrix *)pDiv,local_40,1);
  pVarC->pFirst = pCubeNew2;
  local_40->pFirst = pCubeNew2;
  Fxu_UpdateMatrixDoubleCreateCubes
            ((Fxu_Matrix *)pDiv,pCubeNew2,(Fxu_Cube *)pVarC,(Fxu_Double *)pCube);
  pDiv[2].lPairs.pTail = (Fxu_Pair *)&pDiv[2].lPairs;
  pDiv[2].lPairs.pHead = (Fxu_Pair *)0x0;
  pDiv[2].pPrev = (Fxu_Double *)&pDiv[2].lPairs.nItems;
  *(undefined8 *)&pDiv[2].lPairs.nItems = 0;
  Fxu_UpdateDoublePairs((Fxu_Matrix *)pDiv,(Fxu_Double *)pCube,local_40);
  if (pDiv[2].lPairs.pHead != (Fxu_Pair *)0x0) {
    for (pCubeNew1 = (Fxu_Cube *)pDiv[2].lPairs.pHead; pCubeNew1 != (Fxu_Cube *)0x1;
        pCubeNew1 = pCubeNew1->pOrder) {
      Fxu_UpdateAddNewDoubles((Fxu_Matrix *)pDiv,pCubeNew1);
    }
  }
  Fxu_UpdateCleanOldSingles((Fxu_Matrix *)pDiv);
  Fxu_MatrixRingCubesUnmark((Fxu_Matrix *)pDiv);
  Fxu_MatrixRingVarsUnmark((Fxu_Matrix *)pDiv);
  Fxu_UpdateAddNewSingles((Fxu_Matrix *)pDiv,pVarD);
  Fxu_UpdateAddNewSingles((Fxu_Matrix *)pDiv,local_40);
  if (pCube != (Fxu_Cube *)0x0) {
    Fxu_MemRecycle((Fxu_Matrix *)pDiv,(char *)pCube,0x40);
  }
  pDiv[3].Num = pDiv[3].Num + 1;
  return;
}

Assistant:

void Fxu_UpdateDouble( Fxu_Matrix * p )
{
    Fxu_Double * pDiv;
	Fxu_Cube * pCube, * pCubeNew1, * pCubeNew2;
	Fxu_Var * pVarC, * pVarD;

    // remove the best divisor from the heap
    pDiv = Fxu_HeapDoubleGetMax( p->pHeapDouble );
	// remove the best divisor from the table
	Fxu_ListTableDelDivisor( p, pDiv );

    // create two new columns (vars)
    Fxu_UpdateCreateNewVars( p, &pVarC, &pVarD, 2 );
    // create two new rows (cubes)
    pCubeNew1 = Fxu_MatrixAddCube( p, pVarD, 0 );
    pCubeNew1->pFirst = pCubeNew1;
    pCubeNew2 = Fxu_MatrixAddCube( p, pVarD, 1 );
    pCubeNew2->pFirst = pCubeNew1;
    // set the first cube
    pVarD->pFirst = pCubeNew1;

    // add the literals to the new cubes
    Fxu_UpdateMatrixDoubleCreateCubes( p, pCubeNew1, pCubeNew2, pDiv );

    // start collecting the affected cubes and vars
    Fxu_MatrixRingCubesStart( p );
    Fxu_MatrixRingVarsStart( p );
	// replace each two cubes of the pair by one new cube
	// the new cube contains the base and the new literal
    Fxu_UpdateDoublePairs( p, pDiv, pVarD );
    // stop collecting the affected cubes and vars
    Fxu_MatrixRingCubesStop( p );
    Fxu_MatrixRingVarsStop( p );
    
    // create new doubles; we cannot add them in the same loop
	// because we first have to create *all* new cubes for each node
    Fxu_MatrixForEachCubeInRing( p, pCube )
   		Fxu_UpdateAddNewDoubles( p, pCube );
    // update the singles after removing some literals
    Fxu_UpdateCleanOldSingles( p );

    // undo the temporary rings with cubes and vars
    Fxu_MatrixRingCubesUnmark( p );
    Fxu_MatrixRingVarsUnmark( p );
    // we should undo the rings before creating new singles

    // create new singles
    Fxu_UpdateAddNewSingles( p, pVarC );
    Fxu_UpdateAddNewSingles( p, pVarD );

    // recycle the divisor
	MEM_FREE_FXU( p, Fxu_Double, 1, pDiv );
	p->nDivs2++;
}